

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ulong in_RAX;
  ostream *poVar1;
  ulong uStack_18;
  Colour colourGuard;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001ab090 = 0x2d2d2d2d2d2d2d;
    uRam00000000001ab097._0_1_ = '-';
    uRam00000000001ab097._1_1_ = '-';
    uRam00000000001ab097._2_1_ = '-';
    uRam00000000001ab097._3_1_ = '-';
    uRam00000000001ab097._4_1_ = '-';
    uRam00000000001ab097._5_1_ = '-';
    uRam00000000001ab097._6_1_ = '-';
    uRam00000000001ab097._7_1_ = '-';
    DAT_001ab080 = '-';
    DAT_001ab080_1._0_1_ = '-';
    DAT_001ab080_1._1_1_ = '-';
    DAT_001ab080_1._2_1_ = '-';
    DAT_001ab080_1._3_1_ = '-';
    DAT_001ab080_1._4_1_ = '-';
    DAT_001ab080_1._5_1_ = '-';
    DAT_001ab080_1._6_1_ = '-';
    uRam00000000001ab088 = 0x2d2d2d2d2d2d2d;
    DAT_001ab08f = 0x2d;
    DAT_001ab070 = '-';
    DAT_001ab070_1._0_1_ = '-';
    DAT_001ab070_1._1_1_ = '-';
    DAT_001ab070_1._2_1_ = '-';
    DAT_001ab070_1._3_1_ = '-';
    DAT_001ab070_1._4_1_ = '-';
    DAT_001ab070_1._5_1_ = '-';
    DAT_001ab070_1._6_1_ = '-';
    uRam00000000001ab078._0_1_ = '-';
    uRam00000000001ab078._1_1_ = '-';
    uRam00000000001ab078._2_1_ = '-';
    uRam00000000001ab078._3_1_ = '-';
    uRam00000000001ab078._4_1_ = '-';
    uRam00000000001ab078._5_1_ = '-';
    uRam00000000001ab078._6_1_ = '-';
    uRam00000000001ab078._7_1_ = '-';
    DAT_001ab060 = '-';
    DAT_001ab060_1._0_1_ = '-';
    DAT_001ab060_1._1_1_ = '-';
    DAT_001ab060_1._2_1_ = '-';
    DAT_001ab060_1._3_1_ = '-';
    DAT_001ab060_1._4_1_ = '-';
    DAT_001ab060_1._5_1_ = '-';
    DAT_001ab060_1._6_1_ = '-';
    uRam00000000001ab068._0_1_ = '-';
    uRam00000000001ab068._1_1_ = '-';
    uRam00000000001ab068._2_1_ = '-';
    uRam00000000001ab068._3_1_ = '-';
    uRam00000000001ab068._4_1_ = '-';
    uRam00000000001ab068._5_1_ = '-';
    uRam00000000001ab068._6_1_ = '-';
    uRam00000000001ab068._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam00000000001ab058._0_1_ = '-';
    uRam00000000001ab058._1_1_ = '-';
    uRam00000000001ab058._2_1_ = '-';
    uRam00000000001ab058._3_1_ = '-';
    uRam00000000001ab058._4_1_ = '-';
    uRam00000000001ab058._5_1_ = '-';
    uRam00000000001ab058._6_1_ = '-';
    uRam00000000001ab058._7_1_ = '-';
    DAT_001ab09f = 0;
  }
  uStack_18 = in_RAX;
  poVar1 = std::operator<<((ostream *)
                           (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,'\n');
  uStack_18 = uStack_18 & 0xffffffffffffff;
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::~Colour(&colourGuard);
  return;
}

Assistant:

void ConsoleReporter::printOpenHeader(std::string const& _name) {
    stream << getLineOfChars<'-'>() << '\n';
    {
        Colour colourGuard(Colour::Headers);
        printHeaderString(_name);
    }
}